

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

JavascriptString *
Js::JavascriptString::NewWithBufferT<Js::LiteralString,false>
          (char16 *content,charcount_t cchUseLength,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  CharStringCache *this;
  Recycler *recycler_00;
  JavascriptLibrary *pJVar4;
  StaticType *type;
  charcount_t cchUseBoundLength;
  char16 *buffer;
  StaticType *stringTypeStatic;
  Recycler *recycler;
  ScriptContext *scriptContext_local;
  charcount_t cchUseLength_local;
  char16 *content_local;
  
  if (content == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x49,"(content != nullptr)",
                                "NULL value passed to JavascriptString::New");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = IsValidCharCount((ulong)cchUseLength);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x4a,"(IsValidCharCount(cchUseLength))",
                                "String length will overflow an int");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (cchUseLength == 0) {
    pJVar4 = ScriptContext::GetLibrary(scriptContext);
    content_local = (char16 *)JavascriptLibrary::GetEmptyString(pJVar4);
  }
  else if (cchUseLength == 1) {
    pJVar4 = ScriptContext::GetLibrary(scriptContext);
    this = JavascriptLibrary::GetCharStringCache(pJVar4);
    content_local = (char16 *)CharStringCache::GetStringForChar(this,*content);
  }
  else {
    recycler_00 = ScriptContext::GetRecycler(scriptContext);
    pJVar4 = ScriptContext::GetLibrary(scriptContext);
    type = JavascriptLibrary::GetStringTypeStatic(pJVar4);
    content_local = (char16 *)LiteralString::New(type,content,cchUseLength,recycler_00);
  }
  return (JavascriptString *)content_local;
}

Assistant:

JavascriptString* JavascriptString::NewWithBufferT(const char16 * content, charcount_t cchUseLength, ScriptContext * scriptContext)
    {
        AssertMsg(content != nullptr, "NULL value passed to JavascriptString::New");
        AssertMsg(IsValidCharCount(cchUseLength), "String length will overflow an int");
        switch (cchUseLength)
        {
        case 0:
            return scriptContext->GetLibrary()->GetEmptyString();

        case 1:
            return scriptContext->GetLibrary()->GetCharStringCache().GetStringForChar(*content);

        default:
            break;
        }

        Recycler* recycler = scriptContext->GetRecycler();
        StaticType * stringTypeStatic = scriptContext->GetLibrary()->GetStringTypeStatic();
        char16 const * buffer = content;

        charcount_t cchUseBoundLength = static_cast<charcount_t>(cchUseLength);
        if (copyBuffer)
        {
             buffer = JavascriptString::AllocateLeafAndCopySz(recycler, content, cchUseBoundLength);
        }

        return T::New(stringTypeStatic, buffer, cchUseBoundLength, recycler);
    }